

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O1

int slow_bitmap_andnot(unsigned_long *dst,unsigned_long *bitmap1,unsigned_long *bitmap2,long bits)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  if (0x3f < bits + 0x3fU) {
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar1 = bitmap2[uVar4];
      uVar2 = bitmap1[uVar4];
      dst[uVar4] = ~uVar1 & uVar2;
      uVar5 = uVar5 | ~uVar1 & uVar2;
      uVar4 = uVar4 + 1;
    } while (bits + 0x3fU >> 6 != uVar4);
    uVar3 = (uint)(uVar5 != 0);
  }
  return uVar3;
}

Assistant:

int slow_bitmap_andnot(unsigned long *dst, const unsigned long *bitmap1,
                       const unsigned long *bitmap2, long bits)
{
    long k;
    long nr = BITS_TO_LONGS(bits);
    unsigned long result = 0;

    for (k = 0; k < nr; k++) {
        result |= (dst[k] = bitmap1[k] & ~bitmap2[k]);
    }
    return result != 0;
}